

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

result<double,_toml::error_info> *
toml::read_float<double>
          (result<double,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src
          ,bool is_hex)

{
  undefined3 in_register_00000009;
  source_location *this;
  source_location sStack_108;
  source_location local_90;
  
  this = &sStack_108;
  if (CONCAT31(in_register_00000009,is_hex) == 0) {
    source_location::source_location(&sStack_108,src);
    read_dec_float<double>(__return_storage_ptr__,str,&sStack_108);
  }
  else {
    this = &local_90;
    source_location::source_location(this,src);
    read_hex_float(__return_storage_ptr__,str,this,0.0);
  }
  source_location::~source_location(this);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_float(const std::string& str, const source_location src, const bool is_hex)
{
    if(is_hex)
    {
        return read_hex_float(str, src, T{});
    }
    else
    {
        return read_dec_float<T>(str, src);
    }
}